

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O1

void SetCycErrorNotifyMask(EC_T_DWORD dwInstanceID,EC_T_DWORD dwCycErrorNotifyMask)

{
  EC_T_DWORD dwNumOutData;
  EC_T_IOCTLPARMS oIoCtlParms;
  EC_T_DWORD local_28;
  undefined1 local_24 [4];
  undefined1 *local_20;
  undefined4 local_18;
  undefined8 local_14;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_20 = (undefined1 *)&local_28;
  local_18 = 4;
  local_14 = 0;
  local_c = 0;
  local_8 = local_24;
  local_28 = dwCycErrorNotifyMask;
  emIoControl(dwInstanceID,8);
  return;
}

Assistant:

EC_T_VOID SetCycErrorNotifyMask
    (EC_T_DWORD          dwInstanceID
    ,EC_T_DWORD          dwCycErrorNotifyMask )
{
    emIoCtl(dwInstanceID, EC_IOCTL_SET_CYC_ERROR_NOTIFY_MASK, &dwCycErrorNotifyMask, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
}